

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

_Bool imap_matchresp(char *line,size_t len,char *cmd)

{
  int iVar1;
  byte *pbVar2;
  size_t max;
  byte *pbVar3;
  bool bVar4;
  size_t cmd_len;
  char *end;
  char *cmd_local;
  size_t len_local;
  char *line_local;
  
  pbVar2 = (byte *)(line + len);
  max = strlen(cmd);
  len_local = (size_t)(line + 2);
  if ((len_local < pbVar2) &&
     (iVar1 = Curl_isdigit((uint)*(byte *)len_local), pbVar3 = (byte *)len_local, iVar1 != 0)) {
    do {
      len_local = (size_t)pbVar3;
      pbVar3 = (byte *)(len_local + 1);
      bVar4 = false;
      if (pbVar3 < pbVar2) {
        iVar1 = Curl_isdigit((uint)*pbVar3);
        bVar4 = iVar1 != 0;
      }
    } while (bVar4);
    if ((pbVar3 == pbVar2) || (*pbVar3 != 0x20)) {
      return false;
    }
    len_local = len_local + 2;
  }
  if (((pbVar2 < (byte *)(len_local + max)) ||
      (iVar1 = Curl_strncasecompare((char *)len_local,cmd,max), iVar1 == 0)) ||
     ((*(char *)(len_local + max) != ' ' && ((byte *)(len_local + max + 2) != pbVar2)))) {
    line_local._7_1_ = false;
  }
  else {
    line_local._7_1_ = true;
  }
  return line_local._7_1_;
}

Assistant:

static bool imap_matchresp(const char *line, size_t len, const char *cmd)
{
  const char *end = line + len;
  size_t cmd_len = strlen(cmd);

  /* Skip the untagged response marker */
  line += 2;

  /* Do we have a number after the marker? */
  if(line < end && ISDIGIT(*line)) {
    /* Skip the number */
    do
      line++;
    while(line < end && ISDIGIT(*line));

    /* Do we have the space character? */
    if(line == end || *line != ' ')
      return FALSE;

    line++;
  }

  /* Does the command name match and is it followed by a space character or at
     the end of line? */
  if(line + cmd_len <= end && strncasecompare(line, cmd, cmd_len) &&
     (line[cmd_len] == ' ' || line + cmd_len + 2 == end))
    return TRUE;

  return FALSE;
}